

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O1

FaceHandle __thiscall
OpenMesh::TriConnectivity::add_face
          (TriConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  bool bVar1;
  BaseHandle BVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 local_40;
  VertexHandle vhandles [3];
  
  BVar2.idx_ = PolyConnectivity::InvalidFaceHandle;
  if (2 < _vhs_size) {
    if (_vhs_size == 3) {
      BVar2.idx_ = (int)PolyConnectivity::add_face(&this->super_PolyConnectivity,_vertex_handles,3);
      return (BaseHandle)(BaseHandle)BVar2.idx_;
    }
    local_40 = (ulong)(uint)(_vertex_handles->super_BaseHandle).idx_;
    BVar2.idx_ = -1;
    if (1 < _vhs_size - 1) {
      uVar3 = 1;
      uVar4 = 2;
      do {
        local_40 = CONCAT44(_vertex_handles[uVar3].super_BaseHandle.idx_,local_40._0_4_);
        vhandles[0].super_BaseHandle.idx_ = (BaseHandle)_vertex_handles[uVar4].super_BaseHandle.idx_
        ;
        BVar2.idx_ = (int)PolyConnectivity::add_face
                                    (&this->super_PolyConnectivity,(VertexHandle *)&local_40,3);
        bVar1 = uVar4 < _vhs_size - 1;
        uVar3 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar1);
    }
  }
  return (BaseHandle)(BaseHandle)BVar2.idx_;
}

Assistant:

TriConnectivity::FaceHandle
TriConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  // need at least 3 vertices
  if (_vhs_size < 3) return InvalidFaceHandle;

  /// face is triangle -> ok
  if (_vhs_size == 3)
    return PolyConnectivity::add_face(_vertex_handles, _vhs_size);

  /// face is not a triangle -> triangulate
  else
  {
    //omlog() << "triangulating " << _vhs_size << "_gon\n";

    VertexHandle vhandles[3];
    vhandles[0] = _vertex_handles[0];

    FaceHandle fh;
    unsigned int i(1);
    --_vhs_size;

    while (i < _vhs_size)
    {
      vhandles[1] = _vertex_handles[i];
      vhandles[2] = _vertex_handles[++i];
      fh = PolyConnectivity::add_face(vhandles, 3);
    }

    return fh;
  }
}